

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

void __thiscall bloaty::anon_unknown_0::ElfFile::ElfFile(ElfFile *this,string_view data)

{
  Elf64_Half *pEVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint6 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Elf64_Addr EVar10;
  Elf64_Off EVar11;
  Elf64_Off EVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  ushort uVar17;
  Nonnull<char_*> pcVar18;
  uint uVar19;
  int *piVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ushort uVar25;
  Arg *a0;
  ushort uVar26;
  uint uVar27;
  ushort uVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view sVar34;
  string_view format;
  string_view format_00;
  string local_b0;
  undefined1 local_90 [16];
  char local_80 [24];
  Elf64_Xword local_68;
  uint local_60;
  string_view local_48;
  string_view local_38;
  
  piVar20 = (int *)data._M_str;
  uVar23 = data._M_len;
  (this->data_)._M_len = uVar23;
  (this->data_)._M_str = (char *)piVar20;
  (this->section_name_table_).contents_._M_len = 0;
  (this->section_name_table_).contents_._M_str = (char *)0x0;
  (this->section_name_table_).range_._M_len = 0;
  (this->section_name_table_).range_._M_str = (char *)0x0;
  (this->header_region_)._M_len = 0;
  (this->header_region_)._M_str = (char *)0x0;
  (this->section_headers_)._M_len = 0;
  (this->section_headers_)._M_str = (char *)0x0;
  (this->segment_headers_)._M_len = 0;
  (this->segment_headers_)._M_str = (char *)0x0;
  if ((uVar23 < 0x10) || (*piVar20 != 0x464c457f)) {
    bVar16 = false;
    goto LAB_0019920e;
  }
  bVar2 = *(byte *)(piVar20 + 1);
  bVar3 = *(byte *)((long)piVar20 + 5);
  a0 = (Arg *)0x0;
  bVar16 = false;
  if (bVar2 != 1) {
    if (bVar2 != 2) {
      pcVar18 = absl::numbers_internal::FastIntToBuffer((uint)bVar2,local_80);
      local_90._0_8_ = pcVar18 + -(long)local_80;
      format._M_str = local_90;
      format._M_len = (size_t)"unexpected ELF class: $0";
      local_90._8_8_ = local_80;
      absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x18,format,a0);
      Throw(local_b0._M_dataplus._M_p,0x1d2);
    }
    a0 = (Arg *)0x1;
    bVar16 = true;
  }
  this->is_64bit_ = SUB81(a0,0);
  if (bVar3 == 1) {
    this->is_native_endian_ = true;
    bVar15 = true;
    if (!bVar16) goto LAB_00199057;
    if (uVar23 < 0x40) goto LAB_00199220;
    uVar7 = *(undefined8 *)piVar20;
    uVar8 = *(undefined8 *)(piVar20 + 2);
    uVar9 = *(undefined8 *)(piVar20 + 4);
    EVar10 = *(Elf64_Addr *)(piVar20 + 6);
    EVar11 = *(Elf64_Off *)(piVar20 + 8);
    EVar12 = *(Elf64_Off *)(piVar20 + 10);
    uVar13 = *(undefined8 *)(piVar20 + 0xc);
    uVar14 = *(undefined8 *)(piVar20 + 0xe);
    (this->header_).e_flags = (int)uVar13;
    (this->header_).e_ehsize = (short)((ulong)uVar13 >> 0x20);
    (this->header_).e_phentsize = (short)((ulong)uVar13 >> 0x30);
    (this->header_).e_phnum = (short)uVar14;
    (this->header_).e_shentsize = (short)((ulong)uVar14 >> 0x10);
    (this->header_).e_shnum = (short)((ulong)uVar14 >> 0x20);
    (this->header_).e_shstrndx = (short)((ulong)uVar14 >> 0x30);
    (this->header_).e_phoff = EVar11;
    (this->header_).e_shoff = EVar12;
    (this->header_).e_type = (short)uVar9;
    (this->header_).e_machine = (short)((ulong)uVar9 >> 0x10);
    (this->header_).e_version = (int)((ulong)uVar9 >> 0x20);
    (this->header_).e_entry = EVar10;
    *(undefined8 *)(this->header_).e_ident = uVar7;
    *(undefined8 *)((this->header_).e_ident + 8) = uVar8;
    uVar21 = (this->header_).e_shoff;
  }
  else {
    if (bVar3 != 2) {
      pcVar18 = absl::numbers_internal::FastIntToBuffer((uint)bVar3,local_80);
      local_90._0_8_ = pcVar18 + -(long)local_80;
      format_00._M_str = local_90;
      format_00._M_len = (size_t)"unexpected ELF data: $0";
      local_90._8_8_ = local_80;
      absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x17,format_00,a0);
      Throw(local_b0._M_dataplus._M_p,0x1dd);
    }
    this->is_native_endian_ = false;
    if (bVar16) {
      if (uVar23 < 0x40) goto LAB_00199220;
      uVar7 = *(undefined8 *)piVar20;
      uVar8 = *(undefined8 *)(piVar20 + 2);
      uVar9 = *(undefined8 *)(piVar20 + 4);
      EVar10 = *(Elf64_Addr *)(piVar20 + 6);
      EVar11 = *(Elf64_Off *)(piVar20 + 8);
      EVar12 = *(Elf64_Off *)(piVar20 + 10);
      uVar13 = *(undefined8 *)(piVar20 + 0xc);
      uVar14 = *(undefined8 *)(piVar20 + 0xe);
      (this->header_).e_flags = (int)uVar13;
      (this->header_).e_ehsize = (short)((ulong)uVar13 >> 0x20);
      (this->header_).e_phentsize = (short)((ulong)uVar13 >> 0x30);
      (this->header_).e_phnum = (short)uVar14;
      (this->header_).e_shentsize = (short)((ulong)uVar14 >> 0x10);
      (this->header_).e_shnum = (short)((ulong)uVar14 >> 0x20);
      (this->header_).e_shstrndx = (short)((ulong)uVar14 >> 0x30);
      (this->header_).e_phoff = EVar11;
      (this->header_).e_shoff = EVar12;
      (this->header_).e_type = (short)uVar9;
      (this->header_).e_machine = (short)((ulong)uVar9 >> 0x10);
      (this->header_).e_version = (int)((ulong)uVar9 >> 0x20);
      (this->header_).e_entry = EVar10;
      *(undefined8 *)(this->header_).e_ident = uVar7;
      *(undefined8 *)((this->header_).e_ident + 8) = uVar8;
      pEVar1 = &(this->header_).e_type;
      *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
      pEVar1 = &(this->header_).e_machine;
      *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
      uVar19 = (this->header_).e_version;
      (this->header_).e_version =
           uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      uVar21 = (this->header_).e_entry;
      (this->header_).e_entry =
           uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 | (uVar21 & 0xff0000000000) >> 0x18
           | (uVar21 & 0xff00000000) >> 8 | (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18
           | (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
      uVar21 = (this->header_).e_phoff;
      (this->header_).e_phoff =
           uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 | (uVar21 & 0xff0000000000) >> 0x18
           | (uVar21 & 0xff00000000) >> 8 | (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18
           | (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
      uVar21 = (this->header_).e_shoff;
      uVar21 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
               (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
               (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 | (uVar21 & 0xff00) << 0x28
               | uVar21 << 0x38;
      (this->header_).e_shoff = uVar21;
      uVar19 = (this->header_).e_flags;
      (this->header_).e_flags =
           uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      uVar30._0_2_ = (this->header_).e_ehsize;
      uVar30._2_2_ = (this->header_).e_phentsize;
      uVar30._4_2_ = (this->header_).e_phnum;
      uVar30._6_2_ = (this->header_).e_shentsize;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar30;
      auVar32 = psllw(auVar31,8);
      uVar30 = auVar32._0_8_ |
               CONCAT26((ushort)uVar30._6_2_ >> 8,
                        CONCAT24((ushort)uVar30._4_2_ >> 8,
                                 CONCAT22((ushort)uVar30._2_2_ >> 8,(ushort)(undefined2)uVar30 >> 8)
                                ));
      (this->header_).e_ehsize = (short)uVar30;
      (this->header_).e_phentsize = (short)(uVar30 >> 0x10);
      (this->header_).e_phnum = (short)(uVar30 >> 0x20);
      (this->header_).e_shentsize = (short)(uVar30 >> 0x30);
      pEVar1 = &(this->header_).e_shnum;
      *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
      pEVar1 = &(this->header_).e_shstrndx;
      *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
    }
    else {
      bVar15 = false;
LAB_00199057:
      if (uVar23 < 0x34) {
LAB_00199220:
        Throw("region out-of-bounds",0x5d);
      }
      uVar28 = *(ushort *)(piVar20 + 4);
      uVar17 = *(ushort *)((long)piVar20 + 0x12);
      uVar19 = piVar20[5];
      uVar27 = piVar20[6];
      uVar22 = piVar20[7];
      uVar29 = piVar20[8];
      uVar24 = piVar20[9];
      uVar30 = *(ulong *)(piVar20 + 10);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar30;
      uVar25 = *(ushort *)(piVar20 + 0xc);
      uVar26 = *(ushort *)((long)piVar20 + 0x32);
      uVar7 = *(undefined8 *)(piVar20 + 2);
      *(undefined8 *)(this->header_).e_ident = *(undefined8 *)piVar20;
      *(undefined8 *)((this->header_).e_ident + 8) = uVar7;
      if (!bVar15) {
        uVar28 = uVar28 << 8 | uVar28 >> 8;
        uVar17 = uVar17 << 8 | uVar17 >> 8;
        uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        uVar27 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 | uVar27 << 0x18
        ;
        uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18
        ;
        uVar29 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18
        ;
        uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18
        ;
        auVar32 = psllw(auVar32,8);
        uVar30 = auVar32._0_8_ |
                 CONCAT26((ushort)(uVar30 >> 0x38),
                          CONCAT24((ushort)(uVar30 >> 0x20) >> 8,
                                   CONCAT22((ushort)(uVar30 >> 0x10) >> 8,(ushort)uVar30 >> 8)));
        uVar25 = uVar25 << 8 | uVar25 >> 8;
        uVar26 = uVar26 << 8 | uVar26 >> 8;
      }
      (this->header_).e_type = uVar28;
      uVar21 = (ulong)uVar29;
      (this->header_).e_machine = uVar17;
      (this->header_).e_version = uVar19;
      (this->header_).e_entry = (ulong)uVar27;
      (this->header_).e_phoff = (ulong)uVar22;
      (this->header_).e_shoff = uVar21;
      (this->header_).e_flags = uVar24;
      (this->header_).e_ehsize = (short)uVar30;
      (this->header_).e_phentsize = (short)(uVar30 >> 0x10);
      (this->header_).e_phnum = (short)(uVar30 >> 0x20);
      (this->header_).e_shentsize = (short)(uVar30 >> 0x30);
      (this->header_).e_shnum = uVar25;
      (this->header_).e_shstrndx = uVar26;
    }
  }
  local_38._M_len = 0;
  local_38._M_str = (char *)0x0;
  local_48._M_len = 0;
  local_48._M_str = (char *)0x0;
  if ((uVar21 == 0) || (uVar23 <= uVar21 + (this->header_).e_shentsize)) {
    uVar4._0_2_ = (this->header_).e_shnum;
    uVar4._2_2_ = (this->header_).e_shstrndx;
    uVar6 = CONCAT24(uVar4._2_2_,uVar4);
    auVar33._0_8_ = (ulong)uVar6 & 0xffff;
    auVar33._8_2_ = uVar4._2_2_;
    auVar33._10_6_ = 0;
    this->section_count_ = auVar33._0_8_;
    this->section_string_index_ = auVar33._8_8_;
  }
  else {
    this->section_count_ = 1;
    ReadSection(this,0,(Section *)local_90);
    uVar23 = (ulong)(this->header_).e_shnum;
    this->section_count_ = uVar23;
    uVar28 = (this->header_).e_shstrndx;
    this->section_string_index_ = (ulong)uVar28;
    if (uVar23 == 0) {
      this->section_count_ = local_68;
    }
    if (uVar28 == 0xffff) {
      this->section_string_index_ = (ulong)local_60;
    }
  }
  sVar34 = GetRegion((ElfFile *)(this->data_)._M_len,(uint64_t)(this->data_)._M_str,0);
  this->header_region_ = sVar34;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->section_count_;
  if (SUB168(ZEXT216((this->header_).e_shentsize) * auVar5,8) != 0) {
    Throw("integer overflow in multiply",0x54);
  }
  sVar34 = GetRegion((ElfFile *)(this->data_)._M_len,(uint64_t)(this->data_)._M_str,
                     (this->header_).e_shoff);
  this->section_headers_ = sVar34;
  sVar34 = GetRegion((ElfFile *)(this->data_)._M_len,(uint64_t)(this->data_)._M_str,
                     (this->header_).e_phoff);
  this->segment_headers_ = sVar34;
  if (this->section_count_ != 0) {
    ReadSection(this,(Elf64_Word)this->section_string_index_,&this->section_name_table_);
    if ((this->section_name_table_).header_.sh_type != 3) {
      Throw("section string index pointed to non-strtab",0x204);
    }
  }
  bVar16 = true;
LAB_0019920e:
  this->ok_ = bVar16;
  return;
}

Assistant:

ElfFile(string_view data) : data_(data) {
    ok_ = Initialize();
  }